

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

MoveFull * __thiscall
banksia::BoardCore::createFullMove(BoardCore *this,int from,int dest,PieceType promotion)

{
  ulong uVar1;
  Piece PVar2;
  undefined4 in_EDX;
  long *in_RSI;
  BoardCore *in_RDI;
  BoardCore *pBVar3;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pBVar3 = in_RDI;
  MoveFull::MoveFull((MoveFull *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RSI >> 0x20),(int)in_RSI,(PieceType)((ulong)in_RDI >> 0x20));
  uVar1 = (**(code **)(*in_RSI + 0x30))(in_RSI,in_EDX);
  if ((uVar1 & 1) != 0) {
    PVar2 = getPiece(in_RDI,0);
    *(Piece *)((long)&(in_RDI->pieces).
                      super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                      super__Vector_impl_data._M_start + 4) = PVar2;
  }
  return (MoveFull *)pBVar3;
}

Assistant:

MoveFull BoardCore::createFullMove(int from, int dest, PieceType promotion) const
{
    MoveFull move(from, dest, promotion);
    if (isPositionValid(from)) {
        move.piece = getPiece(from);
    }
    return move;
}